

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::increase_size(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = this->mMask;
  if (sVar4 == 0) {
    init_data(this,8);
    return;
  }
  uVar3 = sVar4 + 1;
  if (uVar3 < 0x28f5c28f5c28f5d) {
    uVar2 = (uVar3 * 0x50) / 100;
  }
  else {
    uVar2 = (uVar3 / 100) * 0x50;
  }
  uVar5 = this->mNumElements;
  if (uVar5 < uVar2) {
    bVar1 = try_increase_info(this);
    if (bVar1) {
      return;
    }
    uVar5 = this->mNumElements;
    sVar4 = this->mMask;
    uVar3 = sVar4 + 1;
  }
  if (uVar3 < 0x28f5c28f5c28f5d) {
    uVar3 = (uVar3 * 0x50) / 100;
  }
  else {
    uVar3 = (uVar3 / 100) * 0x50;
  }
  if (uVar5 * 2 < uVar3) {
    throwOverflowError(this);
    sVar4 = this->mMask;
  }
  rehashPowerOfTwo(this,sVar4 * 2 + 2);
  return;
}

Assistant:

void increase_size() {
        // nothing allocated yet? just allocate InitialNumElements
        if (0 == mMask) {
            init_data(InitialNumElements);
            return;
        }

        auto const maxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        if (mNumElements < maxNumElementsAllowed && try_increase_info()) {
            return;
        }

        ROBIN_HOOD_LOG("mNumElements=" << mNumElements << ", maxNumElementsAllowed="
                                       << maxNumElementsAllowed << ", load="
                                       << (static_cast<double>(mNumElements) * 100.0 /
                                           (static_cast<double>(mMask) + 1)))
        // it seems we have a really bad hash function! don't try to resize again
        if (mNumElements * 2 < calcMaxNumElementsAllowed(mMask + 1)) {
            throwOverflowError();
        }

        rehashPowerOfTwo((mMask + 1) * 2);
    }